

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::WriteObject(ON_BinaryArchive *this,ON_Object *o)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  if (o != (ON_Object *)0x0) {
    bVar1 = WriteObject(this,o);
    return bVar1;
  }
  bVar3 = false;
  bVar1 = BeginWrite3dmBigChunk(this,0x27ffa,0);
  if (bVar1) {
    bVar2 = false;
    bVar1 = BeginWrite3dmBigChunk(this,0x2fffb,0);
    if (bVar1) {
      bVar1 = WriteUuid(this,&ON_nil_uuid);
      bVar2 = EndWrite3dmChunk(this);
      bVar2 = bVar2 && bVar1;
    }
    bVar3 = EndWrite3dmChunk(this);
    bVar3 = (bool)(bVar3 & bVar2);
  }
  return bVar3;
}

Assistant:

bool
ON_BinaryArchive::WriteObject( const ON_Object* o )
{
  bool rc = false;
  if ( o )
    rc = WriteObject(*o);
  else {
    // nullptr object has nil UUID and no date
    rc = BeginWrite3dmChunk( TCODE_OPENNURBS_CLASS, 0 );
    if (rc) {
      rc = BeginWrite3dmChunk( TCODE_OPENNURBS_CLASS_UUID, 0 );
      if ( rc ) {
        rc = WriteUuid( ON_nil_uuid );
        if ( !EndWrite3dmChunk() ) // end of TCODE_OPENNURBS_CLASS_UUID chunk
          rc = false;
      }
      if ( !EndWrite3dmChunk() )
        rc = false;
    }
  }
  return rc;
}